

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

char * kj::_::fill<kj::StringPtr,kj::FixedArray<char,1ul>>
                 (char *target,StringPtr *first,FixedArray<char,_1UL> *rest)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  
  pcVar1 = (first->content).ptr;
  sVar2 = (first->content).size_;
  for (lVar3 = 0; sVar2 - 1 != lVar3; lVar3 = lVar3 + 1) {
    target[lVar3] = pcVar1[lVar3];
  }
  target[lVar3] = rest->content[0];
  return target + lVar3 + 1;
}

Assistant:

inline constexpr const T* end() const { return ptr + size_; }